

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBarsH<float>
               (char *label_id,float *xs,float *ys,int count,double height,int offset,int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<float> getter;
  int stride_local;
  int offset_local;
  double height_local;
  int count_local;
  float *ys_local;
  float *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<float>::GetterXsYs((GetterXsYs<float> *)local_58,xs,ys,count,offset,stride);
  PlotBarsHEx<ImPlot::GetterXsYs<float>,double>(label_id,(GetterXsYs<float> *)local_58,height);
  return;
}

Assistant:

void PlotBarsH(const char* label_id, const T* xs, const T* ys, int count, double height, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsHEx(label_id, getter, height);
}